

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  PFNGLUSEPROGRAMPROC p_Var1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  GLFWwindow *handle;
  Shader *pSVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  char *__to;
  char *__to_00;
  path *ppVar9;
  double dVar10;
  path shader_dir_path;
  path local_1e0;
  path local_1b8;
  Shader shader_bezier;
  path local_170;
  path local_148;
  Shader shader_overlay;
  optional<std::filesystem::__cxx11::path> maybe_shader_dir;
  path local_d0;
  path local_a8;
  path local_80;
  path local_58;
  
  if (argc < 2) {
    std::filesystem::current_path_abi_cxx11_();
    std::filesystem::__cxx11::path::path<char[15],std::filesystem::__cxx11::path>
              (&local_1b8,(char (*) [15])"../src/shader/",auto_format);
    std::filesystem::__cxx11::operator/(&shader_dir_path,&local_1e0,&local_1b8);
    std::filesystem::__cxx11::path::~path(&local_1b8);
    std::filesystem::__cxx11::path::~path(&local_1e0);
  }
  else {
    std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
              (&shader_dir_path,argv + 1,auto_format);
  }
  bVar2 = std::filesystem::exists(&shader_dir_path);
  if (bVar2) {
    std::optional<std::filesystem::__cxx11::path>::optional<std::filesystem::__cxx11::path,_true>
              (&maybe_shader_dir,&shader_dir_path);
    std::filesystem::__cxx11::path::~path(&shader_dir_path);
    if ((maybe_shader_dir.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
         _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
         super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged & 1U) != 0) {
      std::filesystem::__cxx11::path::path(&shader_dir_path,(path *)&maybe_shader_dir);
      glfwInit();
      glfwWindowHint(0x22002,4);
      glfwWindowHint(0x22003,1);
      glfwWindowHint(0x22008,0x32001);
      handle = glfwCreateWindow((anonymous_namespace)::ws,DAT_0014a2ec,
                                "Bezier Curve with OpenGL Tessellation",(GLFWmonitor *)0x0,
                                (GLFWwindow *)0x0);
      if (handle == (GLFWwindow *)0x0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"glfw window create failed");
        std::endl<char,std::char_traits<char>>(poVar6);
        iVar3 = -2;
      }
      else {
        glfwMakeContextCurrent(handle);
        iVar3 = gladLoadGLLoader(glfwGetProcAddress);
        if (iVar3 != 0) {
          glfwSetMouseButtonCallback(handle,anon_unknown.dwarf_5aeb::input::mouse_button_callback);
          glfwSetCursorPosCallback(handle,anon_unknown.dwarf_5aeb::input::cursor_pos_callback);
          glfwSetKeyCallback(handle,anon_unknown.dwarf_5aeb::input::key_callback);
          glfwSetFramebufferSizeCallback
                    (handle,anon_unknown.dwarf_5aeb::input::framebuffer_size_callback);
          Shader::Shader(&shader_bezier);
          Shader::Shader(&shader_overlay);
          std::filesystem::__cxx11::path::path<char[12],std::filesystem::__cxx11::path>
                    (&local_1b8,(char (*) [12])"bezier.vert",auto_format);
          std::filesystem::__cxx11::operator/(&local_1e0,&shader_dir_path,&local_1b8);
          pSVar5 = Shader::attach(&shader_bezier,&local_1e0,0x8b31);
          std::filesystem::__cxx11::path::path<char[16],std::filesystem::__cxx11::path>
                    (&local_170,(char (*) [16])"bezier.tcs.glsl",auto_format);
          std::filesystem::__cxx11::operator/(&local_148,&shader_dir_path,&local_170);
          pSVar5 = Shader::attach(pSVar5,&local_148,0x8e88);
          std::filesystem::__cxx11::path::path<char[16],std::filesystem::__cxx11::path>
                    (&local_80,(char (*) [16])"bezier.tes.glsl",auto_format);
          std::filesystem::__cxx11::operator/(&local_58,&shader_dir_path,&local_80);
          pSVar5 = Shader::attach(pSVar5,&local_58,0x8e87);
          std::filesystem::__cxx11::path::path<char[12],std::filesystem::__cxx11::path>
                    (&local_d0,(char (*) [12])"bezier.frag",auto_format);
          std::filesystem::__cxx11::operator/(&local_a8,&shader_dir_path,&local_d0);
          ppVar9 = &local_a8;
          pSVar5 = Shader::attach(pSVar5,ppVar9,0x8b30);
          Shader::link(pSVar5,(char *)ppVar9,__to);
          std::filesystem::__cxx11::path::~path(&local_a8);
          std::filesystem::__cxx11::path::~path(&local_d0);
          std::filesystem::__cxx11::path::~path(&local_58);
          std::filesystem::__cxx11::path::~path(&local_80);
          std::filesystem::__cxx11::path::~path(&local_148);
          std::filesystem::__cxx11::path::~path(&local_170);
          std::filesystem::__cxx11::path::~path(&local_1e0);
          std::filesystem::__cxx11::path::~path(&local_1b8);
          std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
                    (&local_1b8,(char (*) [13])"overlay.vert",auto_format);
          std::filesystem::__cxx11::operator/(&local_1e0,&shader_dir_path,&local_1b8);
          pSVar5 = Shader::attach(&shader_overlay,&local_1e0,0x8b31);
          std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
                    (&local_170,(char (*) [13])"overlay.frag",auto_format);
          std::filesystem::__cxx11::operator/(&local_148,&shader_dir_path,&local_170);
          ppVar9 = &local_148;
          pSVar5 = Shader::attach(pSVar5,ppVar9,0x8b30);
          Shader::link(pSVar5,(char *)ppVar9,__to_00);
          std::filesystem::__cxx11::path::~path(&local_148);
          std::filesystem::__cxx11::path::~path(&local_170);
          std::filesystem::__cxx11::path::~path(&local_1e0);
          std::filesystem::__cxx11::path::~path(&local_1b8);
          (*glad_glPatchParameteri)(0x8e72,4);
          p_Var1 = glad_glUseProgram;
          GVar4 = Shader::id(&shader_bezier);
          (*p_Var1)(GVar4);
          (*glad_glGenVertexArrays)(1,&DAT_0014a348);
          (*glad_glBindVertexArray)(DAT_0014a348);
          (*glad_glGenBuffers)(1,&DAT_0014a350);
          (*glad_glBindBuffer)(0x8892,DAT_0014a350);
          (*glad_glBufferData)(0x8892,0x20,&DAT_0014a2f8,0x88e8);
          (*glad_glEnableVertexAttribArray)(0);
          (*glad_glVertexAttribPointer)(0,2,0x1406,'\0',0,(void *)0x0);
          p_Var1 = glad_glUseProgram;
          GVar4 = Shader::id(&shader_overlay);
          (*p_Var1)(GVar4);
          (*glad_glGenVertexArrays)(1,&DAT_0014a34c);
          (*glad_glBindVertexArray)(DAT_0014a34c);
          (*glad_glBindBuffer)(0x8892,DAT_0014a350);
          (*glad_glEnableVertexAttribArray)(0);
          (*glad_glVertexAttribPointer)(0,2,0x1406,'\0',0,(void *)0x0);
          (*glad_glGenBuffers)(1,&DAT_0014a354);
          (*glad_glBindBuffer)(0x8892,DAT_0014a354);
          (*glad_glBufferData)(0x8892,0x30,&DAT_0014a318,0x88e4);
          (*glad_glEnableVertexAttribArray)(1);
          (*glad_glVertexAttribPointer)(1,3,0x1406,'\0',0,(void *)0x0);
          (*glad_glLineWidth)(1.0);
          (*glad_glPointSize)(10.0);
          (*glad_glClearColor)(0.227451,0.227451,0.227451,1.0);
          poVar6 = std::operator<<((ostream *)&std::cout,"Before render-loop: GLerror = ");
          (*glad_glGetError)();
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::endl<char,std::char_traits<char>>(poVar6);
          lVar7 = std::chrono::_V2::system_clock::now();
          std::chrono::_V2::system_clock::now();
          do {
            (*glad_glClear)(0x4000);
            p_Var1 = glad_glUseProgram;
            GVar4 = Shader::id(&shader_bezier);
            (*p_Var1)(GVar4);
            (*glad_glBindVertexArray)(DAT_0014a348);
            (*glad_glDrawArrays)(0xe,0,4);
            p_Var1 = glad_glUseProgram;
            GVar4 = Shader::id(&shader_overlay);
            (*p_Var1)(GVar4);
            (*glad_glBindVertexArray)(DAT_0014a34c);
            (*glad_glDrawArrays)(0,0,4);
            glfwSwapBuffers(handle);
            glfwPollEvents();
            lVar8 = std::chrono::_V2::system_clock::now();
            dVar10 = (double)(lVar8 - lVar7) * -1e-09 + 16666667.0;
            if (dVar10 <= 0.0) {
              dVar10 = 0.0;
            }
            local_1e0._M_pathname._M_dataplus._M_p._0_4_ = (float)dVar10;
            std::this_thread::sleep_for<float,std::ratio<1l,1000000000l>>
                      ((duration<float,_std::ratio<1L,_1000000000L>_> *)&local_1e0);
            iVar3 = glfwWindowShouldClose(handle);
            lVar7 = lVar8;
          } while (iVar3 == 0);
          (*glad_glDeleteVertexArrays)(1,&DAT_0014a348);
          (*glad_glDeleteVertexArrays)(1,&DAT_0014a34c);
          (*glad_glDeleteBuffers)(1,&DAT_0014a350);
          (*glad_glDeleteBuffers)(1,&DAT_0014a354);
          Shader::destroy(&shader_bezier);
          glfwDestroyWindow(handle);
          glfwTerminate();
          poVar6 = std::operator<<((ostream *)&std::cout,"After cleanup: GLerror = ");
          (*glad_glGetError)();
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&shader_overlay.createdShaders.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&shader_bezier.createdShaders.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          std::filesystem::__cxx11::path::~path(&shader_dir_path);
          std::_Optional_payload_base<std::filesystem::__cxx11::path>::_M_reset
                    ((_Optional_payload_base<std::filesystem::__cxx11::path> *)&maybe_shader_dir);
          return 0;
        }
        poVar6 = std::operator<<((ostream *)&std::cerr,"GLAD init failed");
        std::endl<char,std::char_traits<char>>(poVar6);
        iVar3 = -3;
      }
      goto LAB_0010963d;
    }
  }
  else {
    std::filesystem::__cxx11::path::~path(&shader_dir_path);
    maybe_shader_dir.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
    super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
    super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged = false;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Please specify shader directory, for example:\n\t"
                          );
  std::operator<<(poVar6,"$ ./bezier \"../src/shader/\"\n");
  iVar3 = -1;
LAB_0010963d:
  exit(iVar3);
}

Assistant:

int main(int argc, char *argv[]) {
  using namespace std::string_literals;

  auto maybe_shader_dir = resrc::path::find_shader_folder(argc, argv);
  if (!maybe_shader_dir.has_value()) {
    std::cout << "Please specify shader directory, for example:\n\t"
              << "$ ./bezier \"../src/shader/\"\n";
    exit(-1);
  }
  const auto shader_dir_path = maybe_shader_dir.value();

  // std::setlocale(LC_ALL, "POSIX");

  // Init glfw
  glfwInit();
  glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
  glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 1);
  glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

  // Get window from glfw + init GLAD
  auto window = glfwCreateWindow(ws.win_sz[0], ws.win_sz[1],
                                 "Bezier Curve with OpenGL Tessellation",
                                 nullptr, nullptr);
  if (window == nullptr) {
    std::cerr << "glfw window create failed" << std::endl;
    exit(-2);
  }
  glfwMakeContextCurrent(window);
  if (!gladLoadGLLoader(GLADloadproc(glfwGetProcAddress))) {
    std::cerr << "GLAD init failed" << std::endl;
    exit(-3);
  }

  // Handle inputs
  glfwSetMouseButtonCallback(window, input::mouse_button_callback);
  glfwSetCursorPosCallback(window, input::cursor_pos_callback);
  glfwSetKeyCallback(window, input::key_callback);
  glfwSetFramebufferSizeCallback(window, input::framebuffer_size_callback);

  Shader shader_bezier, shader_overlay;
  shader_bezier //
      .attach(shader_dir_path / "bezier.vert", GL_VERTEX_SHADER)
      .attach(shader_dir_path / "bezier.tcs.glsl", GL_TESS_CONTROL_SHADER)
      .attach(shader_dir_path / "bezier.tes.glsl", GL_TESS_EVALUATION_SHADER)
      .attach(shader_dir_path / "bezier.frag", GL_FRAGMENT_SHADER)
      .link();
  shader_overlay //
      .attach(shader_dir_path / "overlay.vert", GL_VERTEX_SHADER)
      .attach(shader_dir_path / "overlay.frag", GL_FRAGMENT_SHADER)
      .link();

  // bezier shader
  glPatchParameteri(GL_PATCH_VERTICES, 4);
  glUseProgram(shader_bezier.id());
  glGenVertexArrays(1, &ws.VAO_bezier);
  glBindVertexArray(ws.VAO_bezier);

  // Vertex positions
  glGenBuffers(1, &ws.VBO_pos);

  glBindBuffer(GL_ARRAY_BUFFER, ws.VBO_pos);
  glBufferData(GL_ARRAY_BUFFER, sizeof(V2f) * ws.point_pos.size(),
               ws.point_pos.data(), GL_DYNAMIC_DRAW);
  glEnableVertexAttribArray(0);
  glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, nullptr);

  // overlay shader
  glUseProgram(shader_overlay.id());
  glGenVertexArrays(1, &ws.VAO_overlay);
  glBindVertexArray(ws.VAO_overlay);
  glBindBuffer(GL_ARRAY_BUFFER, ws.VBO_pos);
  glEnableVertexAttribArray(0);
  glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, nullptr);
  glGenBuffers(1, &ws.VBO_color);
  glBindBuffer(GL_ARRAY_BUFFER, ws.VBO_color);
  glBufferData(GL_ARRAY_BUFFER, sizeof(V3f) * ws.point_color.size(),
               ws.point_color.data(), GL_STATIC_DRAW);
  glEnableVertexAttribArray(1);
  glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE, 0, nullptr);

  glLineWidth(gl_line_width);
  glPointSize(gl_point_size);
  glClearColor(gray, gray, gray, 1.0f);

  std::cout << "Before render-loop: GLerror = " << glGetError() << std::endl;

  auto last_frame = std::chrono::high_resolution_clock::now();
  auto current_frame = std::chrono::high_resolution_clock::now();
  auto delta_time = current_frame - last_frame;
  constexpr float OPTIMAL_TIME = 1e9 / TARGET_FPS;

  do { /* Main render loop */
    glClear(GL_COLOR_BUFFER_BIT);
    glUseProgram(shader_bezier.id());
    glBindVertexArray(ws.VAO_bezier);
    glDrawArrays(GL_PATCHES, 0, 4);

    glUseProgram(shader_overlay.id());
    glBindVertexArray(ws.VAO_overlay);
    glDrawArrays(GL_POINTS, 0, 4);

    glfwSwapBuffers(window);
    glfwPollEvents();

    current_frame = std::chrono::high_resolution_clock::now();
    delta_time = current_frame - last_frame;
    last_frame = current_frame;

    std::this_thread::sleep_for(std::chrono::duration<float, std::nano>(
        std::max(0.0, OPTIMAL_TIME - delta_time.count() * 1e-9)));
  } while (!glfwWindowShouldClose(window));

  /* CLEAN-UP */
  glDeleteVertexArrays(1, &ws.VAO_bezier);
  glDeleteVertexArrays(1, &ws.VAO_overlay);
  glDeleteBuffers(1, &ws.VBO_pos);
  glDeleteBuffers(1, &ws.VBO_color);
  shader_bezier.destroy();
  glfwDestroyWindow(window);
  glfwTerminate();

  std::cout << "After cleanup: GLerror = " << glGetError() << std::endl;
}